

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::OnCallSpec<void_(pstore::gsl::span<int,_-1L>)>::Matches
          (OnCallSpec<void_(pstore::gsl::span<int,__1L>)> *this,ArgumentTuple *args)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
  bVar1 = MatcherBase<pstore::gsl::span<int,_-1L>_>::MatchAndExplain
                    ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(this + 0x10),
                     (span<int,__1L> *)args,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
    bVar1 = MatcherBase<const_std::tuple<pstore::gsl::span<int,_-1L>_>_&>::MatchAndExplain
                      ((MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&> *)
                       (this + 0x28),args,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }